

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexSeparableFilter::applyAcrossEdge
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f,int eid)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar6;
  uint uVar7;
  int local_4c;
  FaceInfo *f_00;
  
  local_4c = f->adjfaces[eid];
  uVar6 = (uint)(f->adjedges >> ((char)eid * '\x02' & 0x1fU));
  uVar7 = uVar6 & 3;
  iVar4 = (*this->_tx->_vptr_PtexTexture[0x10])();
  f_00 = (FaceInfo *)CONCAT44(extraout_var,iVar4);
  iVar4 = (eid - uVar7) + 2;
  bVar1 = f_00->flags;
  if ((f->flags & 8) >> 3 != (bVar1 & 8) >> 3) {
    if ((bVar1 & 8) == 0) {
      PtexSeparableKernel::adjustSubfaceToMain(k,eid - (uint)(f_00->adjfaces[uVar7] == faceid));
    }
    else {
      bVar3 = PtexSeparableKernel::adjustMainToSubface(k,eid);
      if (!bVar3) {
        uVar6 = uVar6 - 1 & 3;
        bVar2 = f_00->adjedges;
        local_4c = f_00->adjfaces[uVar6];
        iVar5 = (*this->_tx->_vptr_PtexTexture[0x10])();
        f_00 = (FaceInfo *)CONCAT44(extraout_var_00,iVar5);
        iVar4 = ((uVar6 + iVar4) - (bVar2 >> (char)uVar6 * '\x02' & 3)) + 2;
      }
    }
  }
  PtexSeparableKernel::rotate(k,iVar4);
  if ((bVar1 & 8) == 0) {
    apply(this,k,local_4c,f_00);
    return;
  }
  splitAndApply(this,k,local_4c,f_00);
  return;
}

Assistant:

void PtexSeparableFilter::applyAcrossEdge(PtexSeparableKernel& k,
                                          int faceid, const Ptex::FaceInfo& f, int eid)
{
    int afid = f.adjface(eid), aeid = f.adjedge(eid);
    const Ptex::FaceInfo* af = &_tx->getFaceInfo(afid);
    int rot = eid - aeid + 2;

    // adjust uv coord and res for face/subface boundary
    bool fIsSubface = f.isSubface(), afIsSubface = af->isSubface();
    if (fIsSubface != afIsSubface) {
        if (afIsSubface) {
            // main face to subface transition
            // adjust res and offset uv coord for primary subface
            bool primary = k.adjustMainToSubface(eid);
            if (!primary) {
                // advance ajacent face and edge id to secondary subface
                int neid = (aeid + 3) % 4;
                afid = af->adjface(neid);
                aeid = af->adjedge(neid);
                af = &_tx->getFaceInfo(afid);
                rot += neid - aeid + 2;
            }
        }
        else {
            // subface to main face transition
            // Note: the transform depends on which subface the kernel is
            // coming from.  The "primary" subface is the one the main
            // face is pointing at.  The secondary subface adjustment
            // happens to be the same as for the primary subface for the
            // next edge, so the cases can be combined.
            bool primary = (af->adjface(aeid) == faceid);
            k.adjustSubfaceToMain(eid - primary);
        }
    }

    // rotate and apply (resplit if going to a subface)
    k.rotate(rot);
    if (afIsSubface) splitAndApply(k, afid, *af);
    else apply(k, afid, *af);
}